

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O1

bool __thiscall OpenMD::Globals::addRestraintStamp(Globals *this,RestraintStamp *rest)

{
  pointer *pppRVar1;
  iterator __position;
  RestraintStamp *local_8;
  
  __position._M_current =
       (this->restraints_).
       super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->restraints_).
      super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = rest;
    std::vector<OpenMD::RestraintStamp*,std::allocator<OpenMD::RestraintStamp*>>::
    _M_realloc_insert<OpenMD::RestraintStamp*const&>
              ((vector<OpenMD::RestraintStamp*,std::allocator<OpenMD::RestraintStamp*>> *)
               &this->restraints_,__position,&local_8);
  }
  else {
    *__position._M_current = rest;
    pppRVar1 = &(this->restraints_).
                super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppRVar1 = *pppRVar1 + 1;
  }
  return true;
}

Assistant:

bool Globals::addRestraintStamp(RestraintStamp* rest) {
    restraints_.push_back(rest);
    return true;
  }